

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsocks5socketengine.cpp
# Opt level: O2

void __thiscall
QSocks5SocketEnginePrivate::~QSocks5SocketEnginePrivate(QSocks5SocketEnginePrivate *this)

{
  *(undefined ***)&this->super_QAbstractSocketEnginePrivate =
       &PTR__QSocks5SocketEnginePrivate_002cf040;
  QArrayDataPointer<char>::~QArrayDataPointer(&(this->receivedHeaderFragment).d);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&(this->peerName).d);
  QNetworkProxy::~QNetworkProxy(&this->proxyInfo);
  QAbstractSocketEnginePrivate::~QAbstractSocketEnginePrivate
            (&this->super_QAbstractSocketEnginePrivate);
  return;
}

Assistant:

QSocks5SocketEnginePrivate::~QSocks5SocketEnginePrivate()
{
}